

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icu_backend.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::icu_localization_backend::icu_localization_backend
          (icu_localization_backend *this)

{
  (this->super_localization_backend)._vptr_localization_backend =
       (_func_int **)&PTR__icu_localization_backend_001db1d0;
  (this->paths_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->domains_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->domains_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->domains_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->locale_id_)._M_dataplus._M_p = (pointer)&(this->locale_id_).field_2;
  (this->locale_id_)._M_string_length = 0;
  (this->locale_id_).field_2._M_local_buf[0] = '\0';
  cdata::cdata(&this->data_);
  (this->language_)._M_dataplus._M_p = (pointer)&(this->language_).field_2;
  (this->language_)._M_string_length = 0;
  (this->language_).field_2._M_local_buf[0] = '\0';
  (this->country_)._M_dataplus._M_p = (pointer)&(this->country_).field_2;
  (this->country_)._M_string_length = 0;
  (this->country_).field_2._M_local_buf[0] = '\0';
  (this->variant_)._M_dataplus._M_p = (pointer)&(this->variant_).field_2;
  (this->variant_)._M_string_length = 0;
  (this->variant_).field_2._M_local_buf[0] = '\0';
  (this->real_id_)._M_dataplus._M_p = (pointer)&(this->real_id_).field_2;
  (this->real_id_)._M_string_length = 0;
  (this->real_id_).field_2._M_local_buf[0] = '\0';
  this->invalid_ = true;
  this->use_ansi_encoding_ = false;
  return;
}

Assistant:

icu_localization_backend() : 
            invalid_(true),
            use_ansi_encoding_(false)
        {
        }